

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_function::translate
          (method_function *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  token_base *ptVar2;
  _func_int **pp_Var3;
  compiler_type *this_00;
  _Elt_pointer pdVar4;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *pdVar5;
  pointer pbVar6;
  int iVar7;
  const_reference pptVar8;
  token_base **pptVar9;
  size_type sVar10;
  statement_function *this_01;
  bool is_vargs;
  _func_int **pp_Var11;
  char *__lhs;
  _Elt_pointer pptVar12;
  tree_type<cs::token_base_*> *it;
  _func_int **pp_Var13;
  pointer __lhs_00;
  allocator_type local_1b1;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_1b0;
  size_t local_1a8;
  context_t *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_178 [32];
  string decl;
  string name;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  string local_98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  local_1b0 = raw;
  local_1a0 = context;
  pptVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar8;
  decl._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)&decl);
  pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  std::__cxx11::string::string((string *)&name,(string *)(*pptVar9 + 3));
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  decl._M_dataplus._M_p = (pointer)ptVar1[1]._vptr_token_base;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map =
       (_Map_pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&decl);
  pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  ptVar2 = *pptVar9;
  pp_Var13 = ptVar2[2]._vptr_token_base;
  pp_Var11 = ptVar2[3]._vptr_token_base;
  local_1a8 = ptVar2[3].line_num;
  pp_Var3 = ptVar2[4]._vptr_token_base;
  is_vargs = false;
  while (pp_Var13 != pp_Var3) {
    body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var13;
    pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
    iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
    if (iVar7 == 4) {
      body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var13;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args,(value_type *)(*pptVar9 + 3));
    }
    else {
      body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var13;
      pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
      iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
      if (iVar7 == 5) {
        body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)*pp_Var13;
        pptVar9 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&args,(value_type *)(*pptVar9 + 1));
        is_vargs = true;
      }
    }
    pp_Var13 = pp_Var13 + 1;
    if (pp_Var13 == pp_Var11) {
      pp_Var13 = *(_func_int ***)(local_1a8 + 8);
      local_1a8 = local_1a8 + 8;
      pp_Var11 = pp_Var13 + 0x40;
    }
  }
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  pdVar5 = local_1b0;
  this_00 = (((local_1a0->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178._0_8_ =
       (local_1b0->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_178._8_8_ =
       (local_1b0->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_first;
  local_178._16_8_ =
       (local_1b0->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_last;
  local_178._24_8_ =
       (local_1b0->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_50,(_Self *)local_178,1);
  local_78._M_cur =
       (pdVar5->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_78._M_first =
       (pdVar5->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_78._M_last =
       (pdVar5->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_78._M_node =
       (pdVar5->
       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
       )._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
              *)&decl,&local_50,&local_78,&local_1b1);
  compiler_type::translate
            (this_00,(deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)&decl,&body);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&decl);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                 "function ",&name);
  __lhs = local_178;
  std::operator+(&decl,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 "(");
  std::__cxx11::string::~string((string *)local_178);
  pbVar6 = args.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      args.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __lhs = ")";
    std::__cxx11::string::append((char *)&decl);
  }
  else {
    for (__lhs_00 = args.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __lhs_00 != pbVar6;
        __lhs_00 = __lhs_00 + 1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
                     __lhs_00,", ");
      __lhs = (char *)local_178;
      std::__cxx11::string::append((string *)&decl);
      std::__cxx11::string::~string((string *)local_178);
    }
    std::__cxx11::string::pop_back();
    decl._M_dataplus._M_p[decl._M_string_length - 1] = ')';
  }
  sVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                     ((local_1b0->
                      super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_cur);
  if (sVar10 == 4) {
    __lhs = " override";
    std::__cxx11::string::append((char *)&decl);
  }
  this_01 = (statement_function *)
            statement_base::operator_new((statement_base *)0x188,(size_t)__lhs);
  std::__cxx11::string::string((string *)&local_98,(string *)&name);
  pdVar5 = local_1b0;
  sVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                     ((local_1b0->
                      super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_cur);
  pdVar4 = (pdVar5->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar12 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar12 ==
      (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar12 = (pdVar4->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_function::statement_function
            (this_01,&local_98,&decl,&args,&body,sVar10 == 4,is_vargs,local_1a0,pptVar12[-1]);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&decl);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  std::__cxx11::string::~string((string *)&name);
  return &this_01->super_statement_base;
}

Assistant:

statement_base *
	method_function::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		std::string name = static_cast<token_id *>(t.root().left().data())->get_id();
		std::vector<std::string> args;
		bool is_vargs = false;
		for (auto &it: static_cast<token_arglist *>(t.root().right().data())->get_arglist()) {
			if (it.root().data()->get_type() == token_types::id)
				args.push_back(static_cast<token_id *>(it.root().data())->get_id());
			else if (it.root().data()->get_type() == token_types::vargs) {
				args.push_back(static_cast<token_vargs *>(it.root().data())->get_id());
				is_vargs = true;
			}
		}
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
#ifdef CS_DEBUGGER
		std::string decl="function "+name+"(";
		if(args.size()!=0) {
			for(auto& it:args)
				decl+=it+", ";
			decl.pop_back();
			decl[decl.size()-1]=')';
		}
		else
			decl+=")";
		if(raw.front().size() == 4)
			decl+=" override";
		return new statement_function(name, decl, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#else
		return new statement_function(name, args, body, raw.front().size() == 4, is_vargs, context, raw.front().back());
#endif
	}